

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearSpeed.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearSpeed::ArchiveOUT(ChLinkMotorLinearSpeed *this,ChArchiveOut *marchive)

{
  ChNameValue<bool> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkMotorLinearSpeed>(marchive);
  ChLinkMotorLinear::ArchiveOUT(&this->super_ChLinkMotorLinear,marchive);
  local_30._value = (double *)&(this->super_ChLinkMotorLinear).field_0x278;
  local_30._name = "pos_offset";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->avoid_position_drift;
  local_48._name = "avoid_position_drift";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  return;
}

Assistant:

void ChLinkMotorLinearSpeed::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMotorLinearSpeed>();

    // serialize parent class
    ChLinkMotorLinear::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(pos_offset);
    marchive << CHNVP(avoid_position_drift);
}